

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::PCInterp::interp
          (PCInterp *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,Geometry *param_8,Geometry *param_9,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_10,int param_11,int param_12,
          RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  double *pdVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  
  pdVar18 = (crse->super_BaseFab<double>).dptr;
  iVar1 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  iVar3 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  iVar4 = (crse->super_BaseFab<double>).domain.bigend.vect[2];
  lVar26 = (long)(((crse->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar30 = (((crse->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1) * lVar26;
  pdVar19 = (fine->super_BaseFab<double>).dptr;
  iVar5 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  iVar6 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  iVar7 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  iVar8 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  lVar24 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
  lVar27 = (((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1) * lVar24;
  iVar9 = (fine_region->smallend).vect[0];
  iVar10 = (fine_region->smallend).vect[1];
  iVar11 = (fine_region->smallend).vect[2];
  iVar12 = (fine_region->bigend).vect[0];
  iVar13 = (fine_region->bigend).vect[1];
  iVar14 = (fine_region->bigend).vect[2];
  uVar23 = 0;
  uVar31 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar31 = uVar23;
  }
  for (; uVar23 != uVar31; uVar23 = uVar23 + 1) {
    iVar15 = ratio->vect[2];
    for (uVar29 = (long)iVar11; (long)uVar29 <= (long)iVar14; uVar29 = uVar29 + 1) {
      uVar20 = (uint)uVar29;
      if (iVar15 != 1) {
        if (iVar15 == 4) {
          if ((long)uVar29 < 0) {
            uVar20 = (int)uVar20 >> 2;
          }
          else {
            uVar20 = uVar20 >> 2;
          }
        }
        else if (iVar15 == 2) {
          if ((long)uVar29 < 0) {
            uVar20 = (int)uVar20 >> 1;
          }
          else {
            uVar20 = (uint)(uVar29 >> 1) & 0x7fffffff;
          }
        }
        else if ((long)uVar29 < 0) {
          uVar20 = ~((int)~uVar20 / iVar15);
        }
        else {
          uVar20 = (uint)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) /
                         (long)iVar15);
        }
      }
      iVar16 = ratio->vect[0];
      iVar17 = ratio->vect[1];
      for (uVar25 = (long)iVar10; (long)uVar25 <= (long)iVar13; uVar25 = uVar25 + 1) {
        uVar21 = (uint)uVar25;
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if ((long)uVar25 < 0) {
              uVar21 = (int)uVar21 >> 2;
            }
            else {
              uVar21 = uVar21 >> 2;
            }
          }
          else if (iVar17 == 2) {
            if ((long)uVar25 < 0) {
              uVar21 = (int)uVar21 >> 1;
            }
            else {
              uVar21 = (uint)(uVar25 >> 1) & 0x7fffffff;
            }
          }
          else if ((long)uVar25 < 0) {
            uVar21 = ~((int)~uVar21 / iVar17);
          }
          else {
            uVar21 = (uint)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar25 & 0xffffffff)
                           / (long)iVar17);
          }
        }
        if (iVar9 <= iVar12) {
          uVar28 = (long)iVar9;
          do {
            uVar22 = (uint)uVar28;
            if (iVar16 != 1) {
              if (iVar16 == 4) {
                if ((long)uVar28 < 0) {
                  uVar22 = (int)uVar22 >> 2;
                }
                else {
                  uVar22 = uVar22 >> 2;
                }
              }
              else if (iVar16 == 2) {
                if ((long)uVar28 < 0) {
                  uVar22 = (int)uVar22 >> 1;
                }
                else {
                  uVar22 = (uint)(uVar28 >> 1) & 0x7fffffff;
                }
              }
              else if ((long)uVar28 < 0) {
                uVar22 = ~((int)~uVar22 / iVar16);
              }
              else {
                uVar22 = (uint)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                      uVar28 & 0xffffffff) / (long)iVar16);
              }
            }
            pdVar19[((long)fine_comp + uVar23) * ((iVar8 - iVar7) + 1) * lVar27 +
                    (uVar29 - (long)iVar7) * lVar27 +
                    (uVar25 - (long)iVar6) * lVar24 + (uVar28 - (long)iVar5)] =
                 pdVar18[((long)crse_comp + uVar23) * ((iVar4 - iVar3) + 1) * lVar30 +
                         (int)(uVar20 - iVar3) * lVar30 +
                         (int)(uVar21 - iVar2) * lVar26 + (long)(int)(uVar22 - iVar1)];
            uVar28 = uVar28 + 1;
          } while ((int)uVar28 != iVar12 + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void
PCInterp::interp (const FArrayBox& crse,
                  int              crse_comp,
                  FArrayBox&       fine,
                  int              fine_comp,
                  int              ncomp,
                  const Box&       fine_region,
                  const IntVect&   ratio,
                  const Geometry& /*crse_geom*/,
                  const Geometry& /*fine_geom*/,
                  Vector<BCRec> const& /*bcr*/,
                  int               /*actual_comp*/,
                  int               /*actual_state*/,
                  RunOn             runon)
{
    BL_PROFILE("PCInterp::interp()");

    Array4<Real const> const& crsearr = crse.const_array();
    Array4<Real> const& finearr = fine.array();;

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, fine_region, tbx,
    {
        amrex::pcinterp_interp(tbx,finearr,fine_comp,ncomp,crsearr,crse_comp,ratio);
    });
}